

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O2

optional<unsigned_long> __thiscall graph_utils::Dsu<int>::Size(Dsu<int> *this,int *u)

{
  iterator iVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  optional<int> u_rep;
  _Storage<unsigned_long,_true> local_10;
  
  local_10 = (_Storage<unsigned_long,_true>)Find(this,u);
  if ((local_10._M_value >> 0x20 & 1) == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
            ::find(&(this->size_)._M_t,(key_type *)&local_10._M_value);
    local_10 = (_Storage<unsigned_long,_true>)iVar1._M_node[1]._M_parent;
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> Size(const Type& u) {
    if (auto u_rep = Find(u))
      return size_.find(*u_rep)->second;
    return {};
  }